

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptFunction.cpp
# Opt level: O0

PropertyQueryFlags __thiscall
Js::JavascriptFunction::HasPropertyQuery
          (JavascriptFunction *this,PropertyId propertyId,PropertyValueInfo *info)

{
  bool bVar1;
  PropertyValueInfo *info_local;
  PropertyId propertyId_local;
  JavascriptFunction *this_local;
  
  if (((propertyId | 2U) == 0x1cf) && (bVar1 = HasRestrictedProperties(this), bVar1)) {
    this_local._4_4_ = Property_Found;
  }
  else {
    this_local._4_4_ = DynamicObject::HasPropertyQuery(&this->super_DynamicObject,propertyId,info);
  }
  return this_local._4_4_;
}

Assistant:

PropertyQueryFlags JavascriptFunction::HasPropertyQuery(PropertyId propertyId, _Inout_opt_ PropertyValueInfo* info)
    {
        switch (propertyId)
        {
        case PropertyIds::caller:
        case PropertyIds::arguments:
            if (this->HasRestrictedProperties())
            {
                return PropertyQueryFlags::Property_Found;
            }
            break;
        }
        return DynamicObject::HasPropertyQuery(propertyId, info);
    }